

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O2

int nni_dialer_getopt(nni_dialer *d,char *name,void *valp,size_t *szp,nni_type t)

{
  _func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *p_Var1;
  int iVar2;
  nni_option *pnVar3;
  nng_duration d_00;
  
  iVar2 = strcmp(name,"reconnect-time-max");
  if (iVar2 == 0) {
    nni_mtx_lock(&d->d_mtx);
    d_00 = d->d_maxrtime;
  }
  else {
    iVar2 = strcmp(name,"reconnect-time-min");
    if (iVar2 != 0) {
      p_Var1 = (d->d_ops).d_getopt;
      if ((p_Var1 != (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0) &&
         (iVar2 = (*p_Var1)(d->d_data,name,valp,szp,t), iVar2 != 9)) {
        return iVar2;
      }
      for (pnVar3 = (d->d_ops).d_options;
          (pnVar3 != (nni_option *)0x0 && (pnVar3->o_name != (char *)0x0)); pnVar3 = pnVar3 + 1) {
        iVar2 = strcmp(pnVar3->o_name,name);
        if (iVar2 == 0) {
          if (pnVar3->o_get == (_func_int_void_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
            return 0x19;
          }
          iVar2 = (*pnVar3->o_get)(d->d_data,valp,szp,t);
          return iVar2;
        }
      }
      iVar2 = nni_sock_getopt(d->d_sock,name,valp,szp,t);
      return iVar2;
    }
    nni_mtx_lock(&d->d_mtx);
    d_00 = d->d_inirtime;
  }
  iVar2 = nni_copyout_ms(d_00,valp,szp,t);
  nni_mtx_unlock(&d->d_mtx);
  return iVar2;
}

Assistant:

int
nni_dialer_getopt(
    nni_dialer *d, const char *name, void *valp, size_t *szp, nni_type t)
{
	nni_option *o;

	if (strcmp(name, NNG_OPT_RECONNMAXT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyout_ms(d->d_maxrtime, valp, szp, t);
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}
	if (strcmp(name, NNG_OPT_RECONNMINT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyout_ms(d->d_inirtime, valp, szp, t);
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}

	if (d->d_ops.d_getopt != NULL) {
		int rv = d->d_ops.d_getopt(d->d_data, name, valp, szp, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}
	for (o = d->d_ops.d_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_get == NULL) {
			return (NNG_EWRITEONLY);
		}
		return (o->o_get(d->d_data, valp, szp, t));
	}

	return (nni_sock_getopt(d->d_sock, name, valp, szp, t));
}